

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_mkdtemp(void)

{
  void *pvVar1;
  undefined4 uVar2;
  ssize_t sVar3;
  ushort uVar4;
  int iVar5;
  int extraout_EAX;
  uint uVar6;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  __uid_t _Var7;
  int extraout_EAX_03;
  size_t sVar8;
  uv_loop_t *puVar9;
  uv__io_cb p_Var10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uv_loop_t *unaff_RBX;
  uv_loop_t *puVar16;
  uv_loop_t **ppuVar17;
  uv_loop_t **ppuVar18;
  undefined1 *puVar19;
  unsigned_long *puVar20;
  code **ppcVar21;
  uv_fs_t *unaff_R14;
  uv_fs_t *__buf;
  uv__queue *puVar22;
  undefined8 unaff_R15;
  uv__queue *puVar23;
  uv_buf_t uVar24;
  int64_t eval_b;
  int64_t eval_a;
  long alStack_1518 [11];
  ulong uStack_14c0;
  long lStack_14b8;
  uv_loop_t *puStack_1358;
  uv__queue *puStack_1350;
  undefined8 uStack_1340;
  uv_loop_t *puStack_1338;
  undefined8 uStack_1330;
  uv_loop_t *puStack_1320;
  uv_loop_t *puStack_1318;
  undefined1 auStack_1310 [488];
  undefined8 uStack_1128;
  undefined8 uStack_1118;
  code *pcStack_1110;
  undefined8 uStack_1108;
  unsigned_long uStack_1100;
  uv_loop_t *puStack_10f8;
  uv__io_cb p_Stack_10e8;
  undefined1 auStack_10e0 [120];
  uv_loop_t *puStack_1068;
  uv_loop_t *puStack_f00;
  uv__queue *puStack_ef8;
  undefined8 uStack_ef0;
  uv_loop_t *puStack_ee8;
  uv_loop_t *puStack_ee0;
  undefined1 auStack_ed8 [504];
  uv_loop_t *puStack_ce0;
  uv_loop_t *puStack_cd8;
  undefined1 auStack_cd0 [128];
  uint uStack_c50;
  uv_loop_t *puStack_b08;
  undefined8 uStack_b00;
  uv_loop_t *puStack_af0;
  uv_loop_t *puStack_ae8;
  uv__queue auStack_ae0 [5];
  uv_loop_t *puStack_a88;
  uv_loop_t *puStack_920;
  uv__queue *puStack_918;
  code *pcStack_910;
  undefined8 uStack_900;
  code *pcStack_8f8;
  uv_loop_t *puStack_8e8;
  uv_loop_t *puStack_8e0;
  undefined1 auStack_8d8 [568];
  uv__queue *puStack_6a0;
  uv_loop_t *puStack_538;
  uv_fs_t *puStack_530;
  code *pcStack_528;
  undefined8 uStack_518;
  uv_loop_t *puStack_510;
  undefined8 uStack_508;
  uv_loop_t *puStack_500;
  uv_loop_t *puStack_4f8;
  undefined1 auStack_4f0 [24];
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uv_loop_t *puStack_4c8;
  uv_loop_t *puStack_4c0;
  uv_loop_t *puStack_4b8;
  uv_loop_t *puStack_4b0;
  uv_loop_t *puStack_4a8;
  uv_loop_t *puStack_4a0;
  uv_loop_t *puStack_498;
  uv_loop_t *puStack_490;
  uv_loop_t *puStack_488;
  uv_loop_t *puStack_480;
  uv_fs_t uStack_460;
  uv_loop_t *puStack_2a0;
  uv_fs_t *puStack_298;
  size_t sStack_288;
  unsigned_long uStack_280;
  uv_loop_t *puStack_278;
  uv_fs_t *puStack_270;
  code *pcStack_268;
  undefined8 uStack_260;
  undefined1 auStack_250 [8];
  uv_loop_t *puStack_248;
  undefined1 auStack_240 [112];
  uv_loop_t *puStack_1d0;
  uv_loop_t *puStack_68;
  uv_fs_t *puStack_60;
  uv__queue *local_10;
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar5 = uv_fs_mkdtemp(loop,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  local_10 = (uv__queue *)(long)iVar5;
  if (local_10 == (uv__queue *)0x0) {
    uv_run(loop,0);
    local_10 = (uv__queue *)0x1;
    if (mkdtemp_cb_count != 1) goto LAB_0018fe4e;
    iVar5 = uv_fs_mkdtemp(0,&mkdtemp_req2,"test_dir_XXXXXX",0);
    local_10 = (uv__queue *)(long)iVar5;
    if (local_10 != (uv__queue *)0x0) goto LAB_0018fe5b;
    check_mkdtemp_result(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)mkdtemp_req1.path;
    local_10 = (uv__queue *)0x0;
    iVar5 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
    if (local_10 == (uv__queue *)(long)iVar5) goto LAB_0018fe68;
    rmdir((char *)unaff_RBX);
    rmdir(mkdtemp_req2.path);
    uv_fs_req_cleanup(&mkdtemp_req1);
    uv_fs_req_cleanup(&mkdtemp_req2);
    unaff_RBX = loop;
    uv_walk(loop,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    local_10 = (uv__queue *)0x0;
    iVar5 = uv_loop_close(loop);
    if (local_10 == (uv__queue *)(long)iVar5) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_mkdtemp_cold_1();
LAB_0018fe4e:
    run_test_fs_mkdtemp_cold_2();
LAB_0018fe5b:
    run_test_fs_mkdtemp_cold_3();
LAB_0018fe68:
    run_test_fs_mkdtemp_cold_5();
  }
  puVar9 = (uv_loop_t *)&stack0xfffffffffffffff0;
  run_test_fs_mkdtemp_cold_4();
  if (puVar9 == (uv_loop_t *)&mkdtemp_req1) {
    check_mkdtemp_result(&mkdtemp_req1);
    mkdtemp_cb_count = mkdtemp_cb_count + 1;
    return extraout_EAX;
  }
  mkdtemp_cb_cold_1();
  if (*(uv_fs_type *)(puVar9->reserved + 2) == UV_FS_MKDTEMP) {
    unaff_RBX = puVar9;
    if (puVar9->flags != 0) goto LAB_00190034;
    unaff_R14 = (uv_fs_t *)(puVar9->pending_queue).next;
    if (unaff_R14 == (uv_fs_t *)0x0) goto LAB_00190043;
    sVar8 = strlen((char *)unaff_R14);
    if (sVar8 != 0xf) goto LAB_00190048;
    pvVar1 = unaff_R14->data;
    uVar15 = (ulong)pvVar1 >> 0x38 | ((ulong)pvVar1 & 0xff000000000000) >> 0x28 |
             ((ulong)pvVar1 & 0xff0000000000) >> 0x18 | ((ulong)pvVar1 & 0xff00000000) >> 8 |
             ((ulong)pvVar1 & 0xff000000) << 8 | ((ulong)pvVar1 & 0xff0000) << 0x18 |
             ((ulong)pvVar1 & 0xff00) << 0x28 | (long)pvVar1 << 0x38;
    if (uVar15 == 0x746573745f646972) {
      uVar6 = *(byte *)&unaff_R14->loop - 0x5f;
    }
    else {
      uVar6 = -(uint)(uVar15 < 0x746573745f646972) | 1;
    }
    if (uVar6 != 0) goto LAB_00190057;
    uVar6 = *(uint *)((long)&unaff_R14->loop + 1);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar12 = 0x58585858;
    if (uVar6 == 0x58585858) {
      uVar4 = *(ushort *)((long)&unaff_R14->loop + 5);
      uVar6 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
      uVar12 = 0x5858;
      uVar14 = 0;
      if (uVar6 != 0x5858) goto LAB_0018ffa7;
    }
    else {
LAB_0018ffa7:
      uVar14 = -(uint)(uVar6 < uVar12) | 1;
    }
    if (uVar14 == 0) goto LAB_00190066;
    check_permission((char *)unaff_R14,0x1c0);
    iVar5 = uv_fs_stat(0,&stat_req,(puVar9->pending_queue).next,0);
    if (iVar5 != 0) goto LAB_00190075;
    if ((*(byte *)((long)stat_req.ptr + 9) & 0x40) != 0) {
      iVar5 = uv_fs_req_cleanup(&stat_req);
      return iVar5;
    }
  }
  else {
    check_mkdtemp_result_cold_1();
LAB_00190034:
    check_mkdtemp_result_cold_2();
LAB_00190043:
    check_mkdtemp_result_cold_8();
LAB_00190048:
    check_mkdtemp_result_cold_3();
LAB_00190057:
    check_mkdtemp_result_cold_4();
LAB_00190066:
    check_mkdtemp_result_cold_7();
LAB_00190075:
    check_mkdtemp_result_cold_5();
  }
  check_mkdtemp_result_cold_6();
  puVar9 = (uv_loop_t *)auStack_240;
  auStack_240[0] = 't';
  auStack_240[1] = 'e';
  auStack_240[2] = 's';
  auStack_240[3] = 't';
  auStack_240[4] = '_';
  auStack_240[5] = 'f';
  auStack_240[6] = 'i';
  auStack_240[7] = 'l';
  auStack_240[8] = 'e';
  auStack_240[9] = '_';
  auStack_240[10] = 'X';
  auStack_240[0xb] = 'X';
  auStack_240[0xc] = 'X';
  auStack_240[0xd] = 'X';
  auStack_240[0xe] = 'X';
  auStack_240[0xf] = 'X';
  auStack_240[0x10] = 0;
  pcStack_268 = (code *)0x1900ae;
  puStack_68 = unaff_RBX;
  puStack_60 = unaff_R14;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_268 = (code *)0x1900ce;
  iVar5 = uv_fs_mkstemp(loop,&mkstemp_req1,puVar9,mkstemp_cb);
  auStack_240._24_8_ = SEXT48(iVar5);
  auStack_250 = (undefined1  [8])0x0;
  if ((uv_loop_t *)auStack_240._24_8_ == (uv_loop_t *)0x0) {
    pcStack_268 = (code *)0x1900fc;
    uv_run(loop,0);
    auStack_240._24_8_ = (uv_loop_t *)0x1;
    auStack_250 = (undefined1  [8])(long)mkstemp_cb_count;
    if (auStack_250 != (undefined1  [8])0x1) goto LAB_001904d9;
    pcStack_268 = (code *)0x190136;
    iVar5 = uv_fs_mkstemp(0,&mkstemp_req2,auStack_240,0);
    auStack_240._24_8_ = SEXT48(iVar5);
    auStack_250 = (undefined1  [8])0x0;
    if ((uv_loop_t *)auStack_240._24_8_ != (uv_loop_t *)0x0) goto LAB_001904e8;
    pcStack_268 = (code *)0x190162;
    check_mkstemp_result(&mkstemp_req2);
    uVar2 = (undefined4)mkstemp_req1.result;
    puVar9 = (uv_loop_t *)(ulong)(uint)mkstemp_req2.result;
    auStack_240._24_8_ = (uv_loop_t *)0x0;
    pcStack_268 = (code *)0x19018a;
    iVar5 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    auStack_250 = (undefined1  [8])(long)iVar5;
    if ((undefined1  [8])auStack_240._24_8_ == auStack_250) goto LAB_001904f7;
    auStack_240._24_8_ = (uv_loop_t *)0xffffffffffffffea;
    pcStack_268 = (code *)0x1901c1;
    iVar5 = uv_fs_mkstemp(0,&mkstemp_req3,"test_file",0);
    auStack_250 = (undefined1  [8])(long)iVar5;
    if ((undefined1  [8])auStack_240._24_8_ != auStack_250) goto LAB_00190506;
    pcStack_268 = (code *)0x1901e4;
    auStack_240._24_8_ = strlen(mkstemp_req3.path);
    auStack_250 = (undefined1  [8])0x0;
    if ((uv_loop_t *)auStack_240._24_8_ != (uv_loop_t *)0x0) goto LAB_00190515;
    pcStack_268 = (code *)0x19020e;
    uv_fs_req_cleanup(&mkstemp_req3);
    pcStack_268 = (code *)0x19021f;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_260 = 0;
    pcStack_268 = (code *)0x190257;
    iVar5 = uv_fs_write(0,auStack_240 + 0x18,uVar2,&iov,1,0xffffffffffffffff);
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0xd;
    if (auStack_250 != (undefined1  [8])0xd) goto LAB_00190524;
    auStack_250 = (undefined1  [8])puStack_1d0;
    puStack_248 = (uv_loop_t *)0xd;
    if (puStack_1d0 != (uv_loop_t *)0xd) goto LAB_00190533;
    unaff_R14 = (uv_fs_t *)(auStack_240 + 0x18);
    pcStack_268 = (code *)0x1902aa;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_268 = (code *)0x1902b8;
    uv_fs_close(0,unaff_R14,uVar2,0);
    pcStack_268 = (code *)0x1902c0;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_268 = (code *)0x1902ce;
    uv_fs_close(0,unaff_R14,puVar9,0);
    pcStack_268 = (code *)0x1902d6;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_268 = (code *)0x1902ef;
    iVar5 = uv_fs_open(0,unaff_R14,mkstemp_req1.path,0,0,0);
    puVar16 = puStack_1d0;
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0x0;
    if (auStack_250 != (undefined1  [8])0x0) goto LAB_00190542;
    auStack_250 = (undefined1  [8])puStack_1d0;
    puStack_248 = (uv_loop_t *)0x0;
    if ((long)puStack_1d0 < 0) goto LAB_00190551;
    unaff_R14 = (uv_fs_t *)(auStack_240 + 0x18);
    pcStack_268 = (code *)0x190342;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_268 = (code *)0x190364;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    unaff_R15 = 0;
    uStack_260 = 0;
    pcStack_268 = (code *)0x190399;
    iov = uVar24;
    iVar5 = uv_fs_read(0,unaff_R14,(ulong)puVar16 & 0xffffffff,&iov,1,0xffffffffffffffff);
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0x0;
    if ((long)auStack_250 < 0) goto LAB_00190560;
    auStack_250 = (undefined1  [8])puStack_1d0;
    puStack_248 = (uv_loop_t *)0x0;
    if ((long)puStack_1d0 < 0) goto LAB_0019056f;
    pcStack_268 = (code *)0x1903ee;
    iVar5 = strcmp(buf,test_buf);
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0x0;
    if (auStack_250 != (undefined1  [8])0x0) goto LAB_0019057e;
    puVar19 = auStack_240 + 0x18;
    pcStack_268 = (code *)0x19041b;
    uv_fs_req_cleanup(puVar19);
    pcStack_268 = (code *)0x190429;
    uv_fs_close(0,puVar19,(ulong)puVar16 & 0xffffffff,0);
    pcStack_268 = (code *)0x190431;
    uv_fs_req_cleanup(puVar19);
    pcStack_268 = (code *)0x190444;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_268 = (code *)0x190457;
    unlink(mkstemp_req2.path);
    pcStack_268 = (code *)0x19045f;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_268 = (code *)0x190467;
    uv_fs_req_cleanup(&mkstemp_req2);
    puVar16 = loop;
    pcStack_268 = (code *)0x19047f;
    uv_walk(loop,close_walk_cb,0);
    pcStack_268 = (code *)0x190489;
    uv_run(puVar16,0);
    auStack_250 = (undefined1  [8])0x0;
    pcStack_268 = (code *)0x19049e;
    iVar5 = uv_loop_close(loop);
    puStack_248 = (uv_loop_t *)(long)iVar5;
    if (auStack_250 == (undefined1  [8])puStack_248) {
      pcStack_268 = (code *)0x1904ba;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x1904d9;
    run_test_fs_mkstemp_cold_1();
LAB_001904d9:
    pcStack_268 = (code *)0x1904e8;
    run_test_fs_mkstemp_cold_2();
LAB_001904e8:
    pcStack_268 = (code *)0x1904f7;
    run_test_fs_mkstemp_cold_3();
LAB_001904f7:
    pcStack_268 = (code *)0x190506;
    run_test_fs_mkstemp_cold_14();
LAB_00190506:
    pcStack_268 = (code *)0x190515;
    run_test_fs_mkstemp_cold_4();
LAB_00190515:
    pcStack_268 = (code *)0x190524;
    run_test_fs_mkstemp_cold_5();
LAB_00190524:
    pcStack_268 = (code *)0x190533;
    run_test_fs_mkstemp_cold_6();
LAB_00190533:
    pcStack_268 = (code *)0x190542;
    run_test_fs_mkstemp_cold_7();
LAB_00190542:
    puVar16 = puVar9;
    pcStack_268 = (code *)0x190551;
    run_test_fs_mkstemp_cold_8();
LAB_00190551:
    pcStack_268 = (code *)0x190560;
    run_test_fs_mkstemp_cold_13();
LAB_00190560:
    pcStack_268 = (code *)0x19056f;
    run_test_fs_mkstemp_cold_12();
LAB_0019056f:
    pcStack_268 = (code *)0x19057e;
    run_test_fs_mkstemp_cold_11();
LAB_0019057e:
    pcStack_268 = (code *)0x19058d;
    run_test_fs_mkstemp_cold_9();
  }
  puVar9 = (uv_loop_t *)auStack_250;
  pcStack_268 = mkstemp_cb;
  run_test_fs_mkstemp_cold_10();
  if (puVar9 == (uv_loop_t *)&mkstemp_req1) {
    puStack_270 = (uv_fs_t *)0x1905b5;
    pcStack_268._0_4_ = extraout_EAX_00;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return (int)pcStack_268;
  }
  puStack_270 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  uStack_280 = (unsigned_long)*(uv_fs_type *)(puVar9->reserved + 2);
  sStack_288 = 0x23;
  puStack_278 = puVar16;
  puStack_270 = unaff_R14;
  if (uStack_280 == 0x23) {
    uStack_280 = puVar9->flags;
    sStack_288 = 0;
    if ((long)uStack_280 < 0) goto LAB_0019075b;
    __buf = (uv_fs_t *)(puVar9->pending_queue).next;
    if (__buf == (uv_fs_t *)0x0) goto LAB_0019076a;
    uStack_280 = 0x10;
    puStack_298 = (uv_fs_t *)0x19062e;
    sStack_288 = strlen((char *)__buf);
    if (uStack_280 != sStack_288) goto LAB_0019076f;
    uVar13 = 0x746573745f66696c;
    pvVar1 = __buf->data;
    uVar15 = (ulong)pvVar1 >> 0x38 | ((ulong)pvVar1 & 0xff000000000000) >> 0x28 |
             ((ulong)pvVar1 & 0xff0000000000) >> 0x18 | ((ulong)pvVar1 & 0xff00000000) >> 8 |
             ((ulong)pvVar1 & 0xff000000) << 8 | ((ulong)pvVar1 & 0xff0000) << 0x18 |
             ((ulong)pvVar1 & 0xff00) << 0x28 | (long)pvVar1 << 0x38;
    if (uVar15 == 0x746573745f66696c) {
      uVar4 = *(ushort *)&__buf->loop << 8 | *(ushort *)&__buf->loop >> 8;
      uVar15 = (ulong)uVar4;
      uVar6 = 0;
      if (uVar4 != 0x655f) {
        uVar13 = 0x655f;
        goto LAB_00190672;
      }
    }
    else {
LAB_00190672:
      uVar6 = -(uint)(uVar15 < uVar13) | 1;
    }
    uStack_280 = (unsigned_long)(int)uVar6;
    sStack_288 = 0;
    if (uStack_280 != 0) goto LAB_0019077e;
    uStack_280 = 0;
    uVar6 = *(uint *)((long)&__buf->loop + 2);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar12 = 0x58585858;
    if (uVar6 == 0x58585858) {
      uVar4 = *(ushort *)((long)&__buf->loop + 6);
      uVar6 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
      uVar12 = 0x5858;
      uVar14 = 0;
      if (uVar6 != 0x5858) goto LAB_001906d2;
    }
    else {
LAB_001906d2:
      uVar14 = -(uint)(uVar6 < uVar12) | 1;
    }
    sStack_288 = (size_t)(int)uVar14;
    if (sStack_288 == 0) goto LAB_0019078d;
    puStack_298 = (uv_fs_t *)0x190700;
    check_permission((char *)__buf,0x180);
    puStack_298 = (uv_fs_t *)0x190714;
    iVar5 = uv_fs_stat(0,&stat_req,(puVar9->pending_queue).next,0);
    uStack_280 = (unsigned_long)iVar5;
    sStack_288 = 0;
    if (uStack_280 != 0) goto LAB_0019079c;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      iVar5 = uv_fs_req_cleanup(&stat_req);
      return iVar5;
    }
  }
  else {
    puStack_298 = (uv_fs_t *)0x19075b;
    check_mkstemp_result_cold_1();
    puVar9 = puVar16;
LAB_0019075b:
    puStack_298 = (uv_fs_t *)0x19076a;
    check_mkstemp_result_cold_8();
    __buf = unaff_R14;
LAB_0019076a:
    puStack_298 = (uv_fs_t *)0x19076f;
    check_mkstemp_result_cold_7();
LAB_0019076f:
    puStack_298 = (uv_fs_t *)0x19077e;
    check_mkstemp_result_cold_2();
LAB_0019077e:
    puStack_298 = (uv_fs_t *)0x19078d;
    check_mkstemp_result_cold_3();
LAB_0019078d:
    puStack_298 = (uv_fs_t *)0x19079c;
    check_mkstemp_result_cold_6();
LAB_0019079c:
    puStack_298 = (uv_fs_t *)0x1907ab;
    check_mkstemp_result_cold_4();
  }
  puStack_298 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_5();
  puVar16 = (uv_loop_t *)0x1e9f64;
  puStack_510 = (uv_loop_t *)0x1907c9;
  puStack_2a0 = puVar9;
  puStack_298 = __buf;
  unlink("test_file");
  puStack_510 = (uv_loop_t *)0x1907ce;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_510 = (uv_loop_t *)0x1907f5;
  iVar5 = uv_fs_open(0,&uStack_460,"test_file",0x42,0x180,0);
  sVar3 = uStack_460.result;
  auStack_4f0._0_8_ = SEXT48(iVar5);
  puStack_500 = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_4f0._0_8_ == (uv_loop_t *)0x0) {
    auStack_4f0._0_8_ = uStack_460.result;
    puStack_500 = (uv_loop_t *)0x0;
    puVar16 = (uv_loop_t *)uStack_460.result;
    if (uStack_460.result < 0) goto LAB_00190e64;
    puStack_510 = (uv_loop_t *)0x190848;
    uv_fs_req_cleanup(&uStack_460);
    __buf = (uv_fs_t *)auStack_4f0;
    puStack_510 = (uv_loop_t *)0x19085c;
    memset(__buf,0,0x90);
    puStack_510 = (uv_loop_t *)0x190866;
    iVar5 = fstat64((int)sVar3,(stat64 *)__buf);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0x0;
    puVar16 = (uv_loop_t *)sVar3;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00190e73;
    puStack_510 = (uv_loop_t *)0x190899;
    iVar5 = uv_fs_fstat(0,&uStack_460,sVar3 & 0xffffffff,0);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00190e82;
    puStack_500 = (uv_loop_t *)uStack_460.result;
    puStack_4f8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0x0) goto LAB_00190e91;
    puVar9 = (uv_loop_t *)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_gid;
    if ((puVar9 != (uv_loop_t *)0x0) && (puVar9 != puStack_488)) goto LAB_00190ea0;
    puVar9 = (uv_loop_t *)(long)(int)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_rdev;
    if ((puVar9 != (uv_loop_t *)0x0) && (puStack_480 != puVar9)) goto LAB_00190ea5;
    puStack_510 = (uv_loop_t *)0x19092c;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_508 = 0;
    puStack_510 = (uv_loop_t *)0x190967;
    iov = uVar24;
    iVar5 = uv_fs_write(0,&uStack_460,sVar3 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0xd;
    if (puStack_500 != (uv_loop_t *)0xd) goto LAB_00190eaa;
    puStack_500 = (uv_loop_t *)uStack_460.result;
    puStack_4f8 = (uv_loop_t *)0xd;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0xd) goto LAB_00190eb9;
    __buf = &uStack_460;
    puStack_510 = (uv_loop_t *)0x1909bd;
    uv_fs_req_cleanup(__buf);
    puStack_510 = (uv_loop_t *)0x1909d4;
    memset(&uStack_460.statbuf,0xaa,0xa0);
    puStack_510 = (uv_loop_t *)0x1909e2;
    iVar5 = uv_fs_fstat(0,__buf,sVar3 & 0xffffffff,0);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00190ec8;
    puStack_500 = (uv_loop_t *)uStack_460.result;
    puStack_4f8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0x0) goto LAB_00190ed7;
    puStack_500 = (uv_loop_t *)((void **)((long)uStack_460.ptr + 0x18))[4];
    puStack_4f8 = (uv_loop_t *)0xd;
    __buf = (uv_fs_t *)uStack_460.ptr;
    if (puStack_500 != (uv_loop_t *)0xd) goto LAB_00190ee6;
    puStack_510 = (uv_loop_t *)0x190a5e;
    iVar5 = fstat64((int)sVar3,(stat64 *)auStack_4f0);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00190ef5;
    puStack_500 = (uv_loop_t *)*(void **)uStack_460.ptr;
    puStack_4f8 = (uv_loop_t *)auStack_4f0._0_8_;
    if (puStack_500 != (uv_loop_t *)auStack_4f0._0_8_) goto LAB_00190f04;
    puStack_500 = *(uv_loop_t **)((long)uStack_460.ptr + 8);
    puStack_4f8 = (uv_loop_t *)(ulong)uStack_4d8;
    if (puStack_500 != puStack_4f8) goto LAB_00190f13;
    puStack_500 = *(uv_loop_t **)((long)uStack_460.ptr + 0x10);
    puStack_4f8 = (uv_loop_t *)auStack_4f0._16_8_;
    if (puStack_500 != (uv_loop_t *)auStack_4f0._16_8_) goto LAB_00190f22;
    puStack_500 = *(uv_loop_t **)((long)uStack_460.ptr + 0x18);
    puStack_4f8 = (uv_loop_t *)(ulong)uStack_4d4;
    if (puStack_500 != puStack_4f8) goto LAB_00190f31;
    puStack_500 = (uv_loop_t *)((void **)((long)uStack_460.ptr + 0x18))[1];
    puStack_4f8 = (uv_loop_t *)(ulong)uStack_4d0;
    if (puStack_500 != puStack_4f8) goto LAB_00190f40;
    puStack_500 = (uv_loop_t *)((void **)((long)uStack_460.ptr + 0x18))[2];
    puStack_4f8 = puStack_4c8;
    if (puStack_500 != puStack_4c8) goto LAB_00190f4f;
    puStack_500 = (uv_loop_t *)((void **)((long)uStack_460.ptr + 0x18))[3];
    puStack_4f8 = (uv_loop_t *)auStack_4f0._8_8_;
    if (puStack_500 != (uv_loop_t *)auStack_4f0._8_8_) goto LAB_00190f5e;
    puStack_500 = (uv_loop_t *)((void **)((long)uStack_460.ptr + 0x18))[4];
    puStack_4f8 = puStack_4c0;
    if (puStack_500 != puStack_4c0) goto LAB_00190f6d;
    puStack_500 = (uv_loop_t *)((void **)((long)uStack_460.ptr + 0x18))[5];
    puStack_4f8 = puStack_4b8;
    if (puStack_500 != puStack_4b8) goto LAB_00190f7c;
    puStack_500 = (uv_loop_t *)((timespec *)((long)uStack_460.ptr + 0x48))->tv_sec;
    puStack_4f8 = puStack_4b0;
    if (puStack_500 != puStack_4b0) goto LAB_00190f8b;
    puStack_500 = *(uv_loop_t **)((long)uStack_460.ptr + 0x60);
    puStack_4f8 = puStack_4a8;
    if (puStack_500 != puStack_4a8) goto LAB_00190f9a;
    puStack_500 = (uv_loop_t *)(long)(int)((timespec *)((long)uStack_460.ptr + 0x68))->tv_sec;
    puStack_4f8 = puStack_4a0;
    if (puStack_500 != puStack_4a0) goto LAB_00190fa9;
    puStack_500 = (uv_loop_t *)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_dev;
    puStack_4f8 = puStack_498;
    if (puStack_500 != puStack_498) goto LAB_00190fb8;
    puStack_500 = (uv_loop_t *)(long)(int)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_mode;
    puStack_4f8 = puStack_490;
    if (puStack_500 != puStack_490) goto LAB_00190fc7;
    puStack_500 = (uv_loop_t *)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_nlink;
    puStack_4f8 = puStack_488;
    if (puStack_500 != puStack_488) goto LAB_00190fd6;
    puStack_500 = (uv_loop_t *)(long)(int)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_uid;
    puStack_4f8 = puStack_480;
    if (puStack_500 != puStack_480) goto LAB_00190fe5;
    puStack_500 = *(uv_loop_t **)((long)uStack_460.ptr + 0x50);
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00190ff4;
    puStack_500 = (uv_loop_t *)((timespec *)((long)uStack_460.ptr + 0x58))->tv_sec;
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00191003;
    __buf = &uStack_460;
    puStack_510 = (uv_loop_t *)0x190d0a;
    uv_fs_req_cleanup(__buf);
    puStack_510 = (uv_loop_t *)0x190d22;
    iVar5 = uv_fs_fstat(loop,__buf,sVar3 & 0xffffffff,fstat_cb);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00191012;
    puStack_510 = (uv_loop_t *)0x190d50;
    uv_run(loop,0);
    puStack_500 = (uv_loop_t *)0x1;
    puStack_4f8 = (uv_loop_t *)(long)fstat_cb_count;
    if (puStack_4f8 != (uv_loop_t *)0x1) goto LAB_00191021;
    puStack_510 = (uv_loop_t *)0x190d88;
    iVar5 = uv_fs_close(0,&uStack_460,sVar3 & 0xffffffff,0);
    puStack_500 = (uv_loop_t *)(long)iVar5;
    puStack_4f8 = (uv_loop_t *)0x0;
    if (puStack_500 != (uv_loop_t *)0x0) goto LAB_00191030;
    puStack_500 = (uv_loop_t *)uStack_460.result;
    puStack_4f8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0x0) goto LAB_0019103f;
    puStack_510 = (uv_loop_t *)0x190ddb;
    uv_fs_req_cleanup(&uStack_460);
    puStack_510 = (uv_loop_t *)0x190de9;
    uv_run(loop,0);
    puStack_510 = (uv_loop_t *)0x190df5;
    unlink("test_file");
    puVar16 = loop;
    puStack_510 = (uv_loop_t *)0x190e0d;
    uv_walk(loop,close_walk_cb,0);
    puStack_510 = (uv_loop_t *)0x190e17;
    uv_run(puVar16,0);
    puStack_500 = (uv_loop_t *)0x0;
    puStack_510 = (uv_loop_t *)0x190e2c;
    iVar5 = uv_loop_close(loop);
    puStack_4f8 = (uv_loop_t *)(long)iVar5;
    if (puStack_500 == puStack_4f8) {
      puStack_510 = (uv_loop_t *)0x190e48;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_510 = (uv_loop_t *)0x190e64;
    run_test_fs_fstat_cold_1();
LAB_00190e64:
    puStack_510 = (uv_loop_t *)0x190e73;
    run_test_fs_fstat_cold_36();
LAB_00190e73:
    puStack_510 = (uv_loop_t *)0x190e82;
    run_test_fs_fstat_cold_2();
LAB_00190e82:
    puStack_510 = (uv_loop_t *)0x190e91;
    run_test_fs_fstat_cold_3();
LAB_00190e91:
    puStack_510 = (uv_loop_t *)0x190ea0;
    run_test_fs_fstat_cold_4();
LAB_00190ea0:
    puStack_510 = (uv_loop_t *)0x190ea5;
    run_test_fs_fstat_cold_5();
LAB_00190ea5:
    puStack_510 = (uv_loop_t *)0x190eaa;
    run_test_fs_fstat_cold_6();
LAB_00190eaa:
    puStack_510 = (uv_loop_t *)0x190eb9;
    run_test_fs_fstat_cold_7();
LAB_00190eb9:
    puStack_510 = (uv_loop_t *)0x190ec8;
    run_test_fs_fstat_cold_8();
LAB_00190ec8:
    puStack_510 = (uv_loop_t *)0x190ed7;
    run_test_fs_fstat_cold_9();
LAB_00190ed7:
    puStack_510 = (uv_loop_t *)0x190ee6;
    run_test_fs_fstat_cold_10();
LAB_00190ee6:
    puStack_510 = (uv_loop_t *)0x190ef5;
    run_test_fs_fstat_cold_11();
LAB_00190ef5:
    puStack_510 = (uv_loop_t *)0x190f04;
    run_test_fs_fstat_cold_12();
LAB_00190f04:
    puStack_510 = (uv_loop_t *)0x190f13;
    run_test_fs_fstat_cold_13();
LAB_00190f13:
    puStack_510 = (uv_loop_t *)0x190f22;
    run_test_fs_fstat_cold_14();
LAB_00190f22:
    puStack_510 = (uv_loop_t *)0x190f31;
    run_test_fs_fstat_cold_15();
LAB_00190f31:
    puStack_510 = (uv_loop_t *)0x190f40;
    run_test_fs_fstat_cold_16();
LAB_00190f40:
    puStack_510 = (uv_loop_t *)0x190f4f;
    run_test_fs_fstat_cold_17();
LAB_00190f4f:
    puStack_510 = (uv_loop_t *)0x190f5e;
    run_test_fs_fstat_cold_18();
LAB_00190f5e:
    puStack_510 = (uv_loop_t *)0x190f6d;
    run_test_fs_fstat_cold_19();
LAB_00190f6d:
    puStack_510 = (uv_loop_t *)0x190f7c;
    run_test_fs_fstat_cold_20();
LAB_00190f7c:
    puStack_510 = (uv_loop_t *)0x190f8b;
    run_test_fs_fstat_cold_21();
LAB_00190f8b:
    puStack_510 = (uv_loop_t *)0x190f9a;
    run_test_fs_fstat_cold_22();
LAB_00190f9a:
    puStack_510 = (uv_loop_t *)0x190fa9;
    run_test_fs_fstat_cold_23();
LAB_00190fa9:
    puStack_510 = (uv_loop_t *)0x190fb8;
    run_test_fs_fstat_cold_24();
LAB_00190fb8:
    puStack_510 = (uv_loop_t *)0x190fc7;
    run_test_fs_fstat_cold_25();
LAB_00190fc7:
    puStack_510 = (uv_loop_t *)0x190fd6;
    run_test_fs_fstat_cold_26();
LAB_00190fd6:
    puStack_510 = (uv_loop_t *)0x190fe5;
    run_test_fs_fstat_cold_27();
LAB_00190fe5:
    puStack_510 = (uv_loop_t *)0x190ff4;
    run_test_fs_fstat_cold_28();
LAB_00190ff4:
    puStack_510 = (uv_loop_t *)0x191003;
    run_test_fs_fstat_cold_29();
LAB_00191003:
    puStack_510 = (uv_loop_t *)0x191012;
    run_test_fs_fstat_cold_30();
LAB_00191012:
    puStack_510 = (uv_loop_t *)0x191021;
    run_test_fs_fstat_cold_31();
LAB_00191021:
    puStack_510 = (uv_loop_t *)0x191030;
    run_test_fs_fstat_cold_32();
LAB_00191030:
    puStack_510 = (uv_loop_t *)0x19103f;
    run_test_fs_fstat_cold_33();
LAB_0019103f:
    puStack_510 = (uv_loop_t *)0x19104e;
    run_test_fs_fstat_cold_34();
  }
  ppuVar18 = &puStack_500;
  puStack_510 = (uv_loop_t *)fstat_cb;
  run_test_fs_fstat_cold_35();
  puStack_510 = (uv_loop_t *)(long)*(int *)(ppuVar18 + 9);
  uStack_518 = 8;
  if (puStack_510 == (uv_loop_t *)0x8) {
    puStack_510 = ppuVar18[0xb];
    uStack_518 = 0;
    if (puStack_510 != (uv_loop_t *)0x0) goto LAB_001910de;
    puStack_510 = (uv_loop_t *)ppuVar18[0xc]->reserved[0];
    uStack_518 = 0xd;
    if (puStack_510 == (uv_loop_t *)0xd) {
      pcStack_528 = (code *)0x1910c4;
      iVar5 = uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return iVar5;
    }
  }
  else {
    pcStack_528 = (code *)0x1910de;
    fstat_cb_cold_1();
LAB_001910de:
    pcStack_528 = (code *)0x1910ed;
    fstat_cb_cold_2();
  }
  pcStack_528 = run_test_fs_fstat_stdio;
  fstat_cb_cold_3();
  puVar22 = (uv__queue *)0x0;
  puVar23 = (uv__queue *)&DAT_001eaf84;
  p_Var10 = (uv__io_cb)(auStack_8d8 + 0x1e0);
  puStack_538 = puVar16;
  puStack_530 = __buf;
  pcStack_528 = (code *)unaff_R15;
  do {
    auStack_8d8._456_8_ = (uv__queue *)0x191127;
    iVar5 = uv_fs_fstat(0,p_Var10,*(undefined4 *)((long)&puVar22[0x1eaf8].next + 4),0);
    auStack_8d8._472_8_ = SEXT48(iVar5);
    auStack_8d8._464_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStack_8d8._472_8_ != (uv__queue *)0x0) {
LAB_001911df:
      auStack_8d8._456_8_ = (uv__queue *)0x1911ec;
      run_test_fs_fstat_stdio_cold_1();
      goto LAB_001911ec;
    }
    auStack_8d8._472_8_ = puStack_6a0;
    auStack_8d8._464_8_ = (uv__queue *)0x0;
    if (puStack_6a0 != (uv__queue *)0x0) {
      auStack_8d8._456_8_ = (uv__queue *)0x1911df;
      run_test_fs_fstat_stdio_cold_2();
      goto LAB_001911df;
    }
    auStack_8d8._456_8_ = (uv__queue *)0x19116a;
    uv_fs_req_cleanup();
    puVar22 = (uv__queue *)((long)&puVar22->next + 4);
  } while (puVar22 != (uv__queue *)0xc);
  auStack_8d8._456_8_ = (uv__queue *)0x191179;
  p_Var10 = (uv__io_cb)uv_default_loop();
  auStack_8d8._456_8_ = (uv__queue *)0x19118d;
  uv_walk(p_Var10,close_walk_cb,0);
  auStack_8d8._456_8_ = (uv__queue *)0x191197;
  uv_run(p_Var10,0);
  auStack_8d8._472_8_ = (uv__queue *)0x0;
  auStack_8d8._456_8_ = (uv__queue *)0x1911a5;
  uVar11 = uv_default_loop();
  auStack_8d8._456_8_ = (uv__queue *)0x1911ad;
  iVar5 = uv_loop_close(uVar11);
  auStack_8d8._464_8_ = SEXT48(iVar5);
  if (auStack_8d8._472_8_ == auStack_8d8._464_8_) {
    auStack_8d8._456_8_ = (uv__queue *)0x1911c3;
    uv_library_shutdown();
    return 0;
  }
LAB_001911ec:
  auStack_8d8._456_8_ = run_test_fs_access;
  run_test_fs_fstat_stdio_cold_3();
  puVar9 = (uv_loop_t *)0x1e9f64;
  pcStack_8f8 = (code *)0x191212;
  auStack_8d8._448_8_ = p_Var10;
  auStack_8d8._456_8_ = puVar22;
  unlink("test_file");
  pcStack_8f8 = (code *)0x19121e;
  rmdir("test_dir");
  pcStack_8f8 = (code *)0x191223;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_8f8 = (code *)0x19123e;
  iVar5 = uv_fs_access(0,auStack_8d8,"test_file",0,0);
  puStack_8e0 = (uv_loop_t *)(long)iVar5;
  puStack_8e8 = (uv_loop_t *)0x0;
  if ((long)puStack_8e0 < 0) {
    puStack_8e0 = (uv_loop_t *)auStack_8d8._88_8_;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (-1 < (long)auStack_8d8._88_8_) goto LAB_001915fe;
    puVar9 = (uv_loop_t *)auStack_8d8;
    pcStack_8f8 = (code *)0x19128e;
    uv_fs_req_cleanup(puVar9);
    pcStack_8f8 = (code *)0x1912ad;
    iVar5 = uv_fs_access(loop,puVar9,"test_file",0,access_cb);
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_0019160d;
    pcStack_8f8 = (code *)0x1912db;
    uv_run(loop,0);
    puStack_8e0 = (uv_loop_t *)0x1;
    puStack_8e8 = (uv_loop_t *)(long)access_cb_count;
    if (puStack_8e8 != (uv_loop_t *)0x1) goto LAB_0019161c;
    access_cb_count = 0;
    pcStack_8f8 = (code *)0x19132b;
    iVar5 = uv_fs_open(0,auStack_8d8,"test_file",0x42,0x180,0);
    puVar16 = (uv_loop_t *)auStack_8d8._88_8_;
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_0019162b;
    puStack_8e0 = (uv_loop_t *)auStack_8d8._88_8_;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((long)auStack_8d8._88_8_ < 0) goto LAB_0019163a;
    puVar22 = (uv__queue *)auStack_8d8;
    pcStack_8f8 = (code *)0x19137b;
    uv_fs_req_cleanup(puVar22);
    pcStack_8f8 = (code *)0x191391;
    iVar5 = uv_fs_access(0,puVar22,"test_file",0,0);
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_00191649;
    puStack_8e0 = (uv_loop_t *)auStack_8d8._88_8_;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._88_8_ != (uv_loop_t *)0x0) goto LAB_00191658;
    puVar22 = (uv__queue *)auStack_8d8;
    pcStack_8f8 = (code *)0x1913e1;
    uv_fs_req_cleanup(puVar22);
    pcStack_8f8 = (code *)0x191400;
    iVar5 = uv_fs_access(loop,puVar22,"test_file",0,access_cb);
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_00191667;
    pcStack_8f8 = (code *)0x19142e;
    uv_run(loop,0);
    puStack_8e0 = (uv_loop_t *)0x1;
    puStack_8e8 = (uv_loop_t *)(long)access_cb_count;
    if (puStack_8e8 != (uv_loop_t *)0x1) goto LAB_00191676;
    access_cb_count = 0;
    pcStack_8f8 = (code *)0x19146d;
    iVar5 = uv_fs_close(0,auStack_8d8,(ulong)puVar16 & 0xffffffff,0);
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_00191685;
    puStack_8e0 = (uv_loop_t *)auStack_8d8._88_8_;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._88_8_ != (uv_loop_t *)0x0) goto LAB_00191694;
    puVar16 = (uv_loop_t *)auStack_8d8;
    pcStack_8f8 = (code *)0x1914bd;
    uv_fs_req_cleanup(puVar16);
    pcStack_8f8 = (code *)0x1914d6;
    iVar5 = uv_fs_mkdir(0,puVar16,"test_dir",0x1ff,0);
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_001916a3;
    puVar16 = (uv_loop_t *)auStack_8d8;
    pcStack_8f8 = (code *)0x191503;
    uv_fs_req_cleanup(puVar16);
    pcStack_8f8 = (code *)0x19151c;
    iVar5 = uv_fs_access(0,puVar16,"test_dir",2,0);
    puStack_8e0 = (uv_loop_t *)(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (puStack_8e0 != (uv_loop_t *)0x0) goto LAB_001916b2;
    puStack_8e0 = (uv_loop_t *)auStack_8d8._88_8_;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8d8._88_8_ != (uv_loop_t *)0x0) goto LAB_001916c1;
    pcStack_8f8 = (code *)0x191569;
    uv_fs_req_cleanup(auStack_8d8);
    pcStack_8f8 = (code *)0x191577;
    uv_run(loop,0);
    pcStack_8f8 = (code *)0x191583;
    unlink("test_file");
    pcStack_8f8 = (code *)0x19158f;
    rmdir("test_dir");
    puVar16 = loop;
    pcStack_8f8 = (code *)0x1915a7;
    uv_walk(loop,close_walk_cb,0);
    pcStack_8f8 = (code *)0x1915b1;
    uv_run(puVar16,0);
    puStack_8e0 = (uv_loop_t *)0x0;
    pcStack_8f8 = (code *)0x1915c6;
    iVar5 = uv_loop_close(loop);
    puStack_8e8 = (uv_loop_t *)(long)iVar5;
    if (puStack_8e0 == puStack_8e8) {
      pcStack_8f8 = (code *)0x1915e2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_8f8 = (code *)0x1915fe;
    run_test_fs_access_cold_1();
LAB_001915fe:
    pcStack_8f8 = (code *)0x19160d;
    run_test_fs_access_cold_2();
LAB_0019160d:
    pcStack_8f8 = (code *)0x19161c;
    run_test_fs_access_cold_3();
LAB_0019161c:
    pcStack_8f8 = (code *)0x19162b;
    run_test_fs_access_cold_4();
LAB_0019162b:
    puVar16 = puVar9;
    pcStack_8f8 = (code *)0x19163a;
    run_test_fs_access_cold_5();
LAB_0019163a:
    pcStack_8f8 = (code *)0x191649;
    run_test_fs_access_cold_16();
LAB_00191649:
    pcStack_8f8 = (code *)0x191658;
    run_test_fs_access_cold_6();
LAB_00191658:
    pcStack_8f8 = (code *)0x191667;
    run_test_fs_access_cold_7();
LAB_00191667:
    pcStack_8f8 = (code *)0x191676;
    run_test_fs_access_cold_8();
LAB_00191676:
    pcStack_8f8 = (code *)0x191685;
    run_test_fs_access_cold_9();
LAB_00191685:
    pcStack_8f8 = (code *)0x191694;
    run_test_fs_access_cold_10();
LAB_00191694:
    pcStack_8f8 = (code *)0x1916a3;
    run_test_fs_access_cold_11();
LAB_001916a3:
    pcStack_8f8 = (code *)0x1916b2;
    run_test_fs_access_cold_12();
LAB_001916b2:
    pcStack_8f8 = (code *)0x1916c1;
    run_test_fs_access_cold_13();
LAB_001916c1:
    pcStack_8f8 = (code *)0x1916d0;
    run_test_fs_access_cold_14();
  }
  ppuVar18 = &puStack_8e0;
  pcStack_8f8 = access_cb;
  run_test_fs_access_cold_15();
  pcStack_8f8 = (code *)(long)*(int *)(ppuVar18 + 9);
  uStack_900 = 0xc;
  if (pcStack_8f8 == (code *)0xc) {
    access_cb_count = access_cb_count + 1;
    iVar5 = uv_fs_req_cleanup();
    return iVar5;
  }
  pcStack_910 = run_test_fs_chmod;
  access_cb_cold_1();
  pcStack_910 = (code *)&DAT_001eaf84;
  puVar9 = (uv_loop_t *)0x1e9f64;
  puStack_b08 = (uv_loop_t *)0x19173a;
  puStack_920 = puVar16;
  puStack_918 = puVar22;
  unlink("test_file");
  puStack_b08 = (uv_loop_t *)0x19173f;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_b08 = (uv_loop_t *)0x191763;
  iVar5 = uv_fs_open(0,auStack_ae0,"test_file",0x42,0x180,0);
  puVar16 = puStack_a88;
  puStack_ae8 = (uv_loop_t *)(long)iVar5;
  puStack_af0 = (uv_loop_t *)0x0;
  if (puStack_ae8 == (uv_loop_t *)0x0) {
    puStack_ae8 = puStack_a88;
    puStack_af0 = (uv_loop_t *)0x0;
    puVar9 = puStack_a88;
    if ((long)puStack_a88 < 0) goto LAB_00191bf0;
    puVar22 = auStack_ae0;
    puStack_b08 = (uv_loop_t *)0x1917b3;
    uv_fs_req_cleanup(puVar22);
    puStack_b08 = (uv_loop_t *)0x1917c4;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_b00 = 0;
    puStack_b08 = (uv_loop_t *)0x1917fa;
    iov = uVar24;
    iVar5 = uv_fs_write(0,puVar22,(ulong)puVar16 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0xd;
    puVar9 = puVar16;
    if (puStack_ae8 != (uv_loop_t *)0xd) goto LAB_00191bff;
    puStack_ae8 = puStack_a88;
    puStack_af0 = (uv_loop_t *)0xd;
    if (puStack_a88 != (uv_loop_t *)0xd) goto LAB_00191c0e;
    puVar22 = auStack_ae0;
    puStack_b08 = (uv_loop_t *)0x19184a;
    uv_fs_req_cleanup(puVar22);
    puStack_b08 = (uv_loop_t *)0x191863;
    iVar5 = uv_fs_chmod(0,puVar22,"test_file",0x80,0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_00191c1d;
    puStack_ae8 = puStack_a88;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_a88 != (uv_loop_t *)0x0) goto LAB_00191c2c;
    puVar22 = auStack_ae0;
    puStack_b08 = (uv_loop_t *)0x1918b3;
    uv_fs_req_cleanup(puVar22);
    puVar23 = (uv__queue *)0x1e9f64;
    puStack_b08 = (uv_loop_t *)0x1918c7;
    check_permission("test_file",0x80);
    puStack_b08 = (uv_loop_t *)0x1918dc;
    iVar5 = uv_fs_chmod(0,puVar22,"test_file",0x100,0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_00191c3b;
    puStack_ae8 = puStack_a88;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_a88 != (uv_loop_t *)0x0) goto LAB_00191c4a;
    puVar22 = auStack_ae0;
    puStack_b08 = (uv_loop_t *)0x19192c;
    uv_fs_req_cleanup(puVar22);
    puStack_b08 = (uv_loop_t *)0x19193d;
    check_permission("test_file",0x100);
    puStack_b08 = (uv_loop_t *)0x191951;
    iVar5 = uv_fs_fchmod(0,puVar22,(ulong)puVar16 & 0xffffffff,0x180,0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_00191c59;
    puStack_ae8 = puStack_a88;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_a88 != (uv_loop_t *)0x0) goto LAB_00191c68;
    puVar22 = auStack_ae0;
    puStack_b08 = (uv_loop_t *)0x1919a1;
    uv_fs_req_cleanup(puVar22);
    puVar23 = (uv__queue *)0x1e9f64;
    puStack_b08 = (uv_loop_t *)0x1919b5;
    check_permission("test_file",0x180);
    auStack_ae0[0].next = (uv__queue *)&run_test_fs_chmod::mode;
    puStack_b08 = (uv_loop_t *)0x1919dd;
    iVar5 = uv_fs_chmod(loop,puVar22,"test_file",0x80,chmod_cb);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_00191c77;
    puStack_b08 = (uv_loop_t *)0x191a0b;
    uv_run(loop,0);
    puStack_ae8 = (uv_loop_t *)0x1;
    puStack_af0 = (uv_loop_t *)(long)chmod_cb_count;
    if (puStack_af0 != (uv_loop_t *)0x1) goto LAB_00191c86;
    chmod_cb_count = 0;
    auStack_ae0[0].next = (uv__queue *)&run_test_fs_chmod::mode_1;
    puStack_b08 = (uv_loop_t *)0x191a68;
    iVar5 = uv_fs_chmod(loop,auStack_ae0,"test_file",0x100,chmod_cb);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_00191c95;
    puStack_b08 = (uv_loop_t *)0x191a96;
    uv_run(loop,0);
    puStack_ae8 = (uv_loop_t *)0x1;
    puStack_af0 = (uv_loop_t *)(long)chmod_cb_count;
    if (puStack_af0 != (uv_loop_t *)0x1) goto LAB_00191ca4;
    auStack_ae0[0].next = (uv__queue *)&run_test_fs_chmod::mode_2;
    puStack_b08 = (uv_loop_t *)0x191ae4;
    iVar5 = uv_fs_fchmod(loop,auStack_ae0,(ulong)puVar16 & 0xffffffff,0x180,fchmod_cb);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_00191cb3;
    puStack_b08 = (uv_loop_t *)0x191b12;
    uv_run(loop,0);
    puStack_ae8 = (uv_loop_t *)0x1;
    puStack_af0 = (uv_loop_t *)(long)fchmod_cb_count;
    if (puStack_af0 != (uv_loop_t *)0x1) goto LAB_00191cc2;
    puStack_b08 = (uv_loop_t *)0x191b47;
    iVar5 = uv_fs_close(0,auStack_ae0,(ulong)puVar16 & 0xffffffff,0);
    if (iVar5 != 0) goto LAB_00191cd1;
    if (puStack_a88 != (uv_loop_t *)0x0) goto LAB_00191cd6;
    puStack_b08 = (uv_loop_t *)0x191b65;
    uv_fs_req_cleanup(auStack_ae0);
    puStack_b08 = (uv_loop_t *)0x191b73;
    uv_run(loop,0);
    puStack_b08 = (uv_loop_t *)0x191b7f;
    unlink("test_file");
    puVar9 = loop;
    puStack_b08 = (uv_loop_t *)0x191b97;
    uv_walk(loop,close_walk_cb,0);
    puStack_b08 = (uv_loop_t *)0x191ba1;
    uv_run(puVar9,0);
    puStack_ae8 = (uv_loop_t *)0x0;
    puStack_b08 = (uv_loop_t *)0x191bb6;
    iVar5 = uv_loop_close(loop);
    puStack_af0 = (uv_loop_t *)(long)iVar5;
    if (puStack_ae8 == puStack_af0) {
      puStack_b08 = (uv_loop_t *)0x191bd2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_b08 = (uv_loop_t *)0x191bf0;
    run_test_fs_chmod_cold_1();
LAB_00191bf0:
    puStack_b08 = (uv_loop_t *)0x191bff;
    run_test_fs_chmod_cold_19();
LAB_00191bff:
    puStack_b08 = (uv_loop_t *)0x191c0e;
    run_test_fs_chmod_cold_2();
LAB_00191c0e:
    puStack_b08 = (uv_loop_t *)0x191c1d;
    run_test_fs_chmod_cold_3();
LAB_00191c1d:
    puStack_b08 = (uv_loop_t *)0x191c2c;
    run_test_fs_chmod_cold_4();
LAB_00191c2c:
    puStack_b08 = (uv_loop_t *)0x191c3b;
    run_test_fs_chmod_cold_5();
LAB_00191c3b:
    puStack_b08 = (uv_loop_t *)0x191c4a;
    run_test_fs_chmod_cold_6();
LAB_00191c4a:
    puStack_b08 = (uv_loop_t *)0x191c59;
    run_test_fs_chmod_cold_7();
LAB_00191c59:
    puStack_b08 = (uv_loop_t *)0x191c68;
    run_test_fs_chmod_cold_8();
LAB_00191c68:
    puStack_b08 = (uv_loop_t *)0x191c77;
    run_test_fs_chmod_cold_9();
LAB_00191c77:
    puStack_b08 = (uv_loop_t *)0x191c86;
    run_test_fs_chmod_cold_10();
LAB_00191c86:
    puStack_b08 = (uv_loop_t *)0x191c95;
    run_test_fs_chmod_cold_11();
LAB_00191c95:
    puStack_b08 = (uv_loop_t *)0x191ca4;
    run_test_fs_chmod_cold_12();
LAB_00191ca4:
    puStack_b08 = (uv_loop_t *)0x191cb3;
    run_test_fs_chmod_cold_13();
LAB_00191cb3:
    puStack_b08 = (uv_loop_t *)0x191cc2;
    run_test_fs_chmod_cold_14();
LAB_00191cc2:
    puStack_b08 = (uv_loop_t *)0x191cd1;
    run_test_fs_chmod_cold_15();
LAB_00191cd1:
    puStack_b08 = (uv_loop_t *)0x191cd6;
    run_test_fs_chmod_cold_16();
LAB_00191cd6:
    puStack_b08 = (uv_loop_t *)0x191cdb;
    run_test_fs_chmod_cold_17();
  }
  ppuVar18 = &puStack_ae8;
  ppuVar17 = &puStack_af0;
  puStack_b08 = (uv_loop_t *)check_permission;
  run_test_fs_chmod_cold_18();
  puVar16 = (uv_loop_t *)((ulong)ppuVar17 & 0xffffffff);
  puStack_ce0 = (uv_loop_t *)0x191d05;
  puStack_b08 = puVar9;
  iVar5 = uv_fs_stat(0,auStack_cd0 + 8,ppuVar18,0);
  auStack_cd0._0_8_ = SEXT48(iVar5);
  puStack_cd8 = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_cd0._0_8_ == (uv_loop_t *)0x0) {
    auStack_cd0._0_8_ = auStack_cd0._96_8_;
    puStack_cd8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_cd0._96_8_ != (uv_loop_t *)0x0) goto LAB_00191d7f;
    auStack_cd0._0_8_ = ZEXT48(uStack_c50 & 0x1ff);
    puStack_cd8 = puVar16;
    if ((uv_loop_t *)auStack_cd0._0_8_ == puVar16) {
      puStack_ce0 = (uv_loop_t *)0x191d69;
      iVar5 = uv_fs_req_cleanup(auStack_cd0 + 8);
      return iVar5;
    }
  }
  else {
    puStack_ce0 = (uv_loop_t *)0x191d7f;
    check_permission_cold_1();
LAB_00191d7f:
    puStack_ce0 = (uv_loop_t *)0x191d8c;
    check_permission_cold_2();
  }
  puVar9 = (uv_loop_t *)auStack_cd0;
  puStack_ce0 = (uv_loop_t *)chmod_cb;
  check_permission_cold_3();
  auStack_ed8._496_8_ = SEXT48(*(int *)(puVar9->reserved + 2));
  auStack_ed8._488_4_ = 0xd;
  auStack_ed8._492_4_ = 0;
  puStack_ce0 = puVar16;
  if (auStack_ed8._496_8_ == 0xd) {
    auStack_ed8._496_8_ = puVar9->flags;
    auStack_ed8._488_4_ = 0;
    auStack_ed8._492_4_ = 0;
    if (auStack_ed8._496_8_ == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      auStack_ed8._480_8_ = (uv__queue *)0x191de7;
      uv_fs_req_cleanup(puVar9);
      check_permission("test_file",*(uint *)&((uv__queue *)puVar9->data)->next);
      return extraout_EAX_01;
    }
  }
  else {
    auStack_ed8._480_8_ = (uv__queue *)0x191e0a;
    chmod_cb_cold_1();
    puVar9 = puVar16;
  }
  puVar16 = (uv_loop_t *)(auStack_ed8 + 0x1f0);
  auStack_ed8._480_8_ = fchmod_cb;
  chmod_cb_cold_2();
  auStack_ed8._472_8_ = SEXT48(*(int *)(puVar16->reserved + 2));
  auStack_ed8._464_8_ = (uv__queue *)0xe;
  auStack_ed8._480_8_ = puVar9;
  if ((uv__queue *)auStack_ed8._472_8_ == (uv__queue *)0xe) {
    auStack_ed8._472_8_ = puVar16->flags;
    auStack_ed8._464_8_ = (uv__queue *)0x0;
    auStack_ed8._448_8_ = puVar16;
    if ((uv__queue *)auStack_ed8._472_8_ == (uv__queue *)0x0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      auStack_ed8._456_8_ = (uv__queue *)0x191e65;
      uv_fs_req_cleanup(puVar16);
      check_permission("test_file",*(uint *)&((uv__queue *)puVar16->data)->next);
      return extraout_EAX_02;
    }
  }
  else {
    auStack_ed8._456_8_ = (uv__queue *)0x191e88;
    fchmod_cb_cold_1();
    auStack_ed8._448_8_ = puVar9;
  }
  auStack_ed8._456_8_ = run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar9 = (uv_loop_t *)0x1e9f64;
  puStack_ef8 = (uv__queue *)0x191eae;
  auStack_ed8._456_8_ = puVar22;
  unlink("test_file");
  puStack_ef8 = (uv__queue *)0x191eb3;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_ef8 = (uv__queue *)0x191ed7;
  iVar5 = uv_fs_open(0,auStack_ed8,"test_file",0x42,0x180,0);
  uVar11 = auStack_ed8._88_8_;
  puStack_ee0 = (uv_loop_t *)(long)iVar5;
  puStack_ee8 = (uv_loop_t *)0x0;
  if (puStack_ee0 == (uv_loop_t *)0x0) {
    puStack_ee0 = (uv_loop_t *)auStack_ed8._88_8_;
    puStack_ee8 = (uv_loop_t *)0x0;
    puVar9 = (uv_loop_t *)auStack_ed8._88_8_;
    if ((long)auStack_ed8._88_8_ < 0) goto LAB_00192172;
    puVar22 = (uv__queue *)auStack_ed8;
    puStack_ef8 = (uv__queue *)0x191f27;
    uv_fs_req_cleanup(puVar22);
    puStack_ef8 = (uv__queue *)0x191f38;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_ef0._0_4_ = 0;
    uStack_ef0._4_4_ = 0;
    puStack_ef8 = (uv__queue *)0x191f6e;
    iov = uVar24;
    iVar5 = uv_fs_write(0,puVar22,uVar11 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puStack_ee0 = (uv_loop_t *)(long)iVar5;
    puStack_ee8 = (uv_loop_t *)0xd;
    puVar9 = (uv_loop_t *)uVar11;
    if (puStack_ee0 != (uv_loop_t *)0xd) goto LAB_00192181;
    puStack_ee0 = (uv_loop_t *)auStack_ed8._88_8_;
    puStack_ee8 = (uv_loop_t *)0xd;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0xd) goto LAB_00192190;
    puVar22 = (uv__queue *)auStack_ed8;
    puStack_ef8 = (uv__queue *)0x191fbe;
    uv_fs_req_cleanup(puVar22);
    puStack_ef8 = (uv__queue *)0x191fcc;
    iVar5 = uv_fs_close(0,puVar22,uVar11 & 0xffffffff,0);
    if (iVar5 != 0) goto LAB_0019219f;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0x0) goto LAB_001921a4;
    puVar9 = (uv_loop_t *)auStack_ed8;
    puStack_ef8 = (uv__queue *)0x191fed;
    uv_fs_req_cleanup(puVar9);
    puStack_ef8 = (uv__queue *)0x192006;
    iVar5 = uv_fs_chmod(0,puVar9,"test_file",0x100,0);
    puStack_ee0 = (uv_loop_t *)(long)iVar5;
    puStack_ee8 = (uv_loop_t *)0x0;
    if (puStack_ee0 != (uv_loop_t *)0x0) goto LAB_001921a9;
    puStack_ee0 = (uv_loop_t *)auStack_ed8._88_8_;
    puStack_ee8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0x0) goto LAB_001921b8;
    puVar9 = (uv_loop_t *)auStack_ed8;
    puStack_ef8 = (uv__queue *)0x192056;
    uv_fs_req_cleanup(puVar9);
    puVar22 = (uv__queue *)0x1e9f64;
    puStack_ef8 = (uv__queue *)0x19206a;
    check_permission("test_file",0x100);
    puStack_ef8 = (uv__queue *)0x192079;
    iVar5 = uv_fs_unlink(0,puVar9,"test_file",0);
    puStack_ee0 = (uv_loop_t *)(long)iVar5;
    puStack_ee8 = (uv_loop_t *)0x0;
    if (puStack_ee0 != (uv_loop_t *)0x0) goto LAB_001921c7;
    puStack_ee0 = (uv_loop_t *)auStack_ed8._88_8_;
    puStack_ee8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0x0) goto LAB_001921d6;
    puStack_ef8 = (uv__queue *)0x1920c9;
    uv_fs_req_cleanup(auStack_ed8);
    puStack_ef8 = (uv__queue *)0x1920d7;
    uv_run(loop,0);
    puVar22 = (uv__queue *)0x1e9f64;
    puStack_ef8 = (uv__queue *)0x1920f3;
    uv_fs_chmod(0,auStack_ed8,"test_file",0x180,0);
    puStack_ef8 = (uv__queue *)0x1920fb;
    uv_fs_req_cleanup(auStack_ed8);
    puStack_ef8 = (uv__queue *)0x192103;
    unlink("test_file");
    puVar9 = loop;
    puStack_ef8 = (uv__queue *)0x19211b;
    uv_walk(loop,close_walk_cb,0);
    puStack_ef8 = (uv__queue *)0x192125;
    uv_run(puVar9,0);
    puStack_ee0 = (uv_loop_t *)0x0;
    puStack_ef8 = (uv__queue *)0x19213a;
    iVar5 = uv_loop_close(loop);
    puStack_ee8 = (uv_loop_t *)(long)iVar5;
    if (puStack_ee0 == puStack_ee8) {
      puStack_ef8 = (uv__queue *)0x192156;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_ef8 = (uv__queue *)0x192172;
    run_test_fs_unlink_readonly_cold_1();
LAB_00192172:
    puStack_ef8 = (uv__queue *)0x192181;
    run_test_fs_unlink_readonly_cold_11();
LAB_00192181:
    puStack_ef8 = (uv__queue *)0x192190;
    run_test_fs_unlink_readonly_cold_2();
LAB_00192190:
    puStack_ef8 = (uv__queue *)0x19219f;
    run_test_fs_unlink_readonly_cold_3();
LAB_0019219f:
    puStack_ef8 = (uv__queue *)0x1921a4;
    run_test_fs_unlink_readonly_cold_4();
LAB_001921a4:
    puStack_ef8 = (uv__queue *)0x1921a9;
    run_test_fs_unlink_readonly_cold_5();
LAB_001921a9:
    puStack_ef8 = (uv__queue *)0x1921b8;
    run_test_fs_unlink_readonly_cold_6();
LAB_001921b8:
    puStack_ef8 = (uv__queue *)0x1921c7;
    run_test_fs_unlink_readonly_cold_7();
LAB_001921c7:
    puStack_ef8 = (uv__queue *)0x1921d6;
    run_test_fs_unlink_readonly_cold_8();
LAB_001921d6:
    puStack_ef8 = (uv__queue *)0x1921e5;
    run_test_fs_unlink_readonly_cold_9();
  }
  puStack_ef8 = (uv__queue *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_10();
  puVar16 = (uv_loop_t *)0x1e9f64;
  auStack_10e0._0_8_ = (uv__queue *)0x19220d;
  puStack_f00 = puVar9;
  puStack_ef8 = puVar22;
  unlink("test_file");
  auStack_10e0._0_8_ = (uv__queue *)0x192219;
  unlink("test_file_link");
  auStack_10e0._0_8_ = (uv__queue *)0x19221e;
  loop = (uv_loop_t *)uv_default_loop();
  auStack_10e0._0_8_ = (uv__queue *)0x192242;
  iVar5 = uv_fs_open(0,auStack_10e0 + 0x20,"test_file",0x42,0x180,0);
  puVar9 = puStack_1068;
  auStack_10e0._24_8_ = SEXT48(iVar5);
  auStack_10e0._16_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_10e0._24_8_ == (uv_loop_t *)0x0) {
    auStack_10e0._24_8_ = puStack_1068;
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    puVar16 = puStack_1068;
    if ((long)puStack_1068 < 0) goto LAB_00192728;
    puVar22 = (uv__queue *)(auStack_10e0 + 0x20);
    auStack_10e0._0_8_ = (uv__queue *)0x192292;
    uv_fs_req_cleanup(puVar22);
    auStack_10e0._0_8_ = (uv__queue *)0x1922b1;
    iVar5 = uv_fs_chown(0,puVar22,"test_file",0xffffffff,0xffffffff,0);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    puVar16 = puVar9;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_00192737;
    auStack_10e0._24_8_ = puStack_1068;
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if (puStack_1068 != (uv_loop_t *)0x0) goto LAB_00192746;
    puVar22 = (uv__queue *)(auStack_10e0 + 0x20);
    auStack_10e0._0_8_ = (uv__queue *)0x192301;
    uv_fs_req_cleanup(puVar22);
    auStack_10e0._0_8_ = (uv__queue *)0x19231b;
    iVar5 = uv_fs_fchown(0,puVar22,(ulong)puVar9 & 0xffffffff,0xffffffff,0xffffffff,0);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_00192755;
    auStack_10e0._24_8_ = puStack_1068;
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if (puStack_1068 != (uv_loop_t *)0x0) goto LAB_00192764;
    puVar22 = (uv__queue *)(auStack_10e0 + 0x20);
    auStack_10e0._0_8_ = (uv__queue *)0x19236b;
    uv_fs_req_cleanup(puVar22);
    auStack_10e0._0_8_ = (uv__queue *)0x192393;
    iVar5 = uv_fs_chown(loop,puVar22,"test_file",0xffffffff,0xffffffff,chown_cb);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_00192773;
    auStack_10e0._0_8_ = (uv__queue *)0x1923c1;
    uv_run(loop,0);
    auStack_10e0._24_8_ = (uv_loop_t *)0x1;
    auStack_10e0._16_8_ = SEXT48(chown_cb_count);
    if ((uv_loop_t *)auStack_10e0._16_8_ != (uv_loop_t *)0x1) goto LAB_00192782;
    chown_cb_count = 0;
    auStack_10e0._0_8_ = (uv__queue *)0x192414;
    iVar5 = uv_fs_chown(loop,auStack_10e0 + 0x20,"test_file",0,0,chown_root_cb);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_00192791;
    auStack_10e0._0_8_ = (uv__queue *)0x192442;
    uv_run(loop,0);
    auStack_10e0._24_8_ = (uv_loop_t *)0x1;
    auStack_10e0._16_8_ = SEXT48(chown_cb_count);
    if ((uv_loop_t *)auStack_10e0._16_8_ != (uv_loop_t *)0x1) goto LAB_001927a0;
    auStack_10e0._0_8_ = (uv__queue *)0x19248c;
    iVar5 = uv_fs_fchown(loop,auStack_10e0 + 0x20,(ulong)puVar9 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_001927af;
    auStack_10e0._0_8_ = (uv__queue *)0x1924ba;
    uv_run(loop,0);
    auStack_10e0._24_8_ = (uv_loop_t *)0x1;
    auStack_10e0._16_8_ = SEXT48(fchown_cb_count);
    if ((uv_loop_t *)auStack_10e0._16_8_ != (uv_loop_t *)0x1) goto LAB_001927be;
    auStack_10e0._0_8_ = (uv__queue *)0x1924fc;
    iVar5 = uv_fs_link(0,auStack_10e0 + 0x20,"test_file","test_file_link",0);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_001927cd;
    auStack_10e0._24_8_ = puStack_1068;
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if (puStack_1068 != (uv_loop_t *)0x0) goto LAB_001927dc;
    puVar22 = (uv__queue *)(auStack_10e0 + 0x20);
    auStack_10e0._0_8_ = (uv__queue *)0x19254c;
    uv_fs_req_cleanup(puVar22);
    auStack_10e0._0_8_ = (uv__queue *)0x19256b;
    iVar5 = uv_fs_lchown(0,puVar22,"test_file_link",0xffffffff,0xffffffff,0);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_001927eb;
    auStack_10e0._24_8_ = puStack_1068;
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if (puStack_1068 != (uv_loop_t *)0x0) goto LAB_001927fa;
    puVar22 = (uv__queue *)(auStack_10e0 + 0x20);
    auStack_10e0._0_8_ = (uv__queue *)0x1925bb;
    uv_fs_req_cleanup(puVar22);
    auStack_10e0._0_8_ = (uv__queue *)0x1925e3;
    iVar5 = uv_fs_lchown(loop,puVar22,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_00192809;
    auStack_10e0._0_8_ = (uv__queue *)0x192611;
    uv_run(loop,0);
    auStack_10e0._24_8_ = (uv_loop_t *)0x1;
    auStack_10e0._16_8_ = SEXT48(lchown_cb_count);
    if ((uv_loop_t *)auStack_10e0._16_8_ != (uv_loop_t *)0x1) goto LAB_00192818;
    auStack_10e0._0_8_ = (uv__queue *)0x192646;
    iVar5 = uv_fs_close(0,auStack_10e0 + 0x20,(ulong)puVar9 & 0xffffffff,0);
    auStack_10e0._24_8_ = SEXT48(iVar5);
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_10e0._24_8_ != (uv_loop_t *)0x0) goto LAB_00192827;
    auStack_10e0._24_8_ = puStack_1068;
    auStack_10e0._16_8_ = (uv_loop_t *)0x0;
    if (puStack_1068 != (uv_loop_t *)0x0) goto LAB_00192836;
    auStack_10e0._0_8_ = (uv__queue *)0x192693;
    uv_fs_req_cleanup(auStack_10e0 + 0x20);
    auStack_10e0._0_8_ = (uv__queue *)0x1926a1;
    uv_run(loop,0);
    auStack_10e0._0_8_ = (uv__queue *)0x1926ad;
    unlink("test_file");
    auStack_10e0._0_8_ = (uv__queue *)0x1926b9;
    unlink("test_file_link");
    puVar16 = loop;
    auStack_10e0._0_8_ = (uv__queue *)0x1926d1;
    uv_walk(loop,close_walk_cb,0);
    auStack_10e0._0_8_ = (uv__queue *)0x1926db;
    uv_run(puVar16,0);
    auStack_10e0._24_8_ = (uv_loop_t *)0x0;
    auStack_10e0._0_8_ = (uv__queue *)0x1926f0;
    iVar5 = uv_loop_close(loop);
    auStack_10e0._16_8_ = SEXT48(iVar5);
    if (auStack_10e0._24_8_ == auStack_10e0._16_8_) {
      auStack_10e0._0_8_ = (uv__queue *)0x19270c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_10e0._0_8_ = (uv__queue *)0x192728;
    run_test_fs_chown_cold_1();
LAB_00192728:
    auStack_10e0._0_8_ = (uv__queue *)0x192737;
    run_test_fs_chown_cold_21();
LAB_00192737:
    auStack_10e0._0_8_ = (uv__queue *)0x192746;
    run_test_fs_chown_cold_2();
LAB_00192746:
    auStack_10e0._0_8_ = (uv__queue *)0x192755;
    run_test_fs_chown_cold_3();
LAB_00192755:
    auStack_10e0._0_8_ = (uv__queue *)0x192764;
    run_test_fs_chown_cold_4();
LAB_00192764:
    auStack_10e0._0_8_ = (uv__queue *)0x192773;
    run_test_fs_chown_cold_5();
LAB_00192773:
    auStack_10e0._0_8_ = (uv__queue *)0x192782;
    run_test_fs_chown_cold_6();
LAB_00192782:
    auStack_10e0._0_8_ = (uv__queue *)0x192791;
    run_test_fs_chown_cold_7();
LAB_00192791:
    auStack_10e0._0_8_ = (uv__queue *)0x1927a0;
    run_test_fs_chown_cold_8();
LAB_001927a0:
    auStack_10e0._0_8_ = (uv__queue *)0x1927af;
    run_test_fs_chown_cold_9();
LAB_001927af:
    auStack_10e0._0_8_ = (uv__queue *)0x1927be;
    run_test_fs_chown_cold_10();
LAB_001927be:
    auStack_10e0._0_8_ = (uv__queue *)0x1927cd;
    run_test_fs_chown_cold_11();
LAB_001927cd:
    auStack_10e0._0_8_ = (uv__queue *)0x1927dc;
    run_test_fs_chown_cold_12();
LAB_001927dc:
    auStack_10e0._0_8_ = (uv__queue *)0x1927eb;
    run_test_fs_chown_cold_13();
LAB_001927eb:
    auStack_10e0._0_8_ = (uv__queue *)0x1927fa;
    run_test_fs_chown_cold_14();
LAB_001927fa:
    auStack_10e0._0_8_ = (uv__queue *)0x192809;
    run_test_fs_chown_cold_15();
LAB_00192809:
    auStack_10e0._0_8_ = (uv__queue *)0x192818;
    run_test_fs_chown_cold_16();
LAB_00192818:
    auStack_10e0._0_8_ = (uv__queue *)0x192827;
    run_test_fs_chown_cold_17();
LAB_00192827:
    auStack_10e0._0_8_ = (uv__queue *)0x192836;
    run_test_fs_chown_cold_18();
LAB_00192836:
    auStack_10e0._0_8_ = (uv__queue *)0x192845;
    run_test_fs_chown_cold_19();
  }
  puVar19 = auStack_10e0 + 0x18;
  auStack_10e0._0_8_ = chown_cb;
  run_test_fs_chown_cold_20();
  auStack_10e0._0_8_ = SEXT48(*(int *)(puVar19 + 0x48));
  p_Stack_10e8 = (uv__io_cb)0x1a;
  if ((uv__queue *)auStack_10e0._0_8_ == (uv__queue *)0x1a) {
    auStack_10e0._0_8_ = *(undefined8 *)(puVar19 + 0x58);
    p_Stack_10e8 = (uv__io_cb)0x0;
    if ((uv__queue *)auStack_10e0._0_8_ == (uv__queue *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar5 = uv_fs_req_cleanup();
      return iVar5;
    }
  }
  else {
    puStack_10f8 = (uv_loop_t *)0x1928b2;
    chown_cb_cold_1();
  }
  puVar9 = (uv_loop_t *)auStack_10e0;
  puStack_10f8 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  uStack_1100 = (unsigned_long)*(int *)(puVar9->reserved + 2);
  uStack_1108._0_4_ = 0x1a;
  uStack_1108._4_4_ = 0;
  puStack_10f8 = puVar16;
  if (uStack_1100 == 0x1a) {
    pcStack_1110 = (code *)0x1928ea;
    _Var7 = geteuid();
    if (_Var7 != 0) {
      uStack_1100 = puVar9->flags;
      uStack_1108._0_4_ = 0xffffffff;
      uStack_1108._4_4_ = 0xffffffff;
      if (uStack_1100 == 0xffffffffffffffff) goto LAB_00192933;
      pcStack_1110 = (code *)0x192917;
      chown_root_cb_cold_2();
    }
    uStack_1100 = puVar9->flags;
    uStack_1108._0_4_ = 0;
    uStack_1108._4_4_ = 0;
    puVar16 = puVar9;
    if (uStack_1100 == 0) {
LAB_00192933:
      chown_cb_count = chown_cb_count + 1;
      iVar5 = uv_fs_req_cleanup(puVar9);
      return iVar5;
    }
  }
  else {
    pcStack_1110 = (code *)0x192953;
    chown_root_cb_cold_1();
  }
  puVar20 = &uStack_1100;
  pcStack_1110 = fchown_cb;
  chown_root_cb_cold_3();
  pcStack_1110 = (code *)(long)(int)puVar20[9];
  uStack_1118._0_4_ = 0x1b;
  uStack_1118._4_4_ = 0;
  if (pcStack_1110 == (code *)0x1b) {
    pcStack_1110 = (code *)puVar20[0xb];
    uStack_1118._0_4_ = 0;
    uStack_1118._4_4_ = 0;
    if (pcStack_1110 == (code *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar5 = uv_fs_req_cleanup();
      return iVar5;
    }
  }
  else {
    uStack_1128._0_4_ = 0x1929be;
    uStack_1128._4_4_ = 0;
    fchown_cb_cold_1();
  }
  ppcVar21 = &pcStack_1110;
  uStack_1128 = lchown_cb;
  fchown_cb_cold_2();
  uStack_1128 = (code *)(long)*(int *)(ppcVar21 + 9);
  auStack_1310._480_8_ = (uv__queue *)0x1c;
  if (uStack_1128 == (code *)0x1c) {
    uStack_1128 = ppcVar21[0xb];
    auStack_1310._480_8_ = (uv__queue *)0x0;
    if (uStack_1128 == (code *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar5 = uv_fs_req_cleanup();
      return iVar5;
    }
  }
  else {
    auStack_1310._464_8_ = (uv__queue *)0x192a2b;
    lchown_cb_cold_1();
  }
  auStack_1310._464_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar9 = (uv_loop_t *)0x1e9f64;
  puStack_1338 = (uv_loop_t *)0x192a55;
  auStack_1310._448_8_ = puVar16;
  auStack_1310._456_8_ = puVar22;
  auStack_1310._464_8_ = puVar23;
  unlink("test_file");
  puStack_1338 = (uv_loop_t *)0x192a61;
  unlink("test_file_link");
  puStack_1338 = (uv_loop_t *)0x192a6d;
  unlink("test_file_link2");
  puStack_1338 = (uv_loop_t *)0x192a72;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_1338 = (uv_loop_t *)0x192a96;
  iVar5 = uv_fs_open(0,auStack_1310,"test_file",0x42,0x180,0);
  uVar11 = auStack_1310._88_8_;
  puStack_1318 = (uv_loop_t *)(long)iVar5;
  puStack_1320 = (uv_loop_t *)0x0;
  if (puStack_1318 == (uv_loop_t *)0x0) {
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0x0;
    puVar9 = (uv_loop_t *)auStack_1310._88_8_;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_00192ff4;
    puVar22 = (uv__queue *)auStack_1310;
    puStack_1338 = (uv_loop_t *)0x192ae6;
    uv_fs_req_cleanup(puVar22);
    puStack_1338 = (uv_loop_t *)0x192af7;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_1330 = 0;
    puStack_1338 = (uv_loop_t *)0x192b2d;
    iov = uVar24;
    iVar5 = uv_fs_write(0,puVar22,uVar11 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0xd;
    puVar9 = (uv_loop_t *)uVar11;
    if (puStack_1318 != (uv_loop_t *)0xd) goto LAB_00193003;
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0xd;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0xd) goto LAB_00193012;
    puVar22 = (uv__queue *)auStack_1310;
    puStack_1338 = (uv_loop_t *)0x192b7d;
    uv_fs_req_cleanup(puVar22);
    puStack_1338 = (uv_loop_t *)0x192b8b;
    iVar5 = uv_fs_close(0,puVar22,uVar11 & 0xffffffff,0);
    if (iVar5 != 0) goto LAB_00193021;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_00193026;
    puVar9 = (uv_loop_t *)auStack_1310;
    puStack_1338 = (uv_loop_t *)0x192bac;
    uv_fs_req_cleanup(puVar9);
    puStack_1338 = (uv_loop_t *)0x192bc7;
    iVar5 = uv_fs_link(0,puVar9,"test_file","test_file_link",0);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if (puStack_1318 != (uv_loop_t *)0x0) goto LAB_0019302b;
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_0019303a;
    puStack_1338 = (uv_loop_t *)0x192c17;
    uv_fs_req_cleanup((uv_loop_t *)auStack_1310);
    puStack_1338 = (uv_loop_t *)0x192c33;
    iVar5 = uv_fs_open(0,(uv_loop_t *)auStack_1310,"test_file_link",2,0,0);
    puVar16 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    puVar9 = (uv_loop_t *)auStack_1310;
    if (puStack_1318 != (uv_loop_t *)0x0) goto LAB_00193049;
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_00193058;
    puVar22 = (uv__queue *)auStack_1310;
    puStack_1338 = (uv_loop_t *)0x192c83;
    uv_fs_req_cleanup(puVar22);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_1338 = (uv_loop_t *)0x192ca5;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1330 = 0;
    puStack_1338 = (uv_loop_t *)0x192cd6;
    iov = uVar24;
    iVar5 = uv_fs_read(0,puVar22,(ulong)puVar16 & 0xffffffff,&iov,1,0);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((long)puStack_1318 < 0) goto LAB_00193067;
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_00193076;
    puStack_1338 = (uv_loop_t *)0x192d28;
    iVar5 = strcmp(buf,test_buf);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if (puStack_1318 != (uv_loop_t *)0x0) goto LAB_00193085;
    puStack_1338 = (uv_loop_t *)0x192d58;
    iVar5 = uv_fs_close(0,auStack_1310,(ulong)puVar16 & 0xffffffff,0);
    if (iVar5 != 0) goto LAB_00193094;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_00193099;
    puVar16 = (uv_loop_t *)auStack_1310;
    puStack_1338 = (uv_loop_t *)0x192d79;
    uv_fs_req_cleanup(puVar16);
    puStack_1338 = (uv_loop_t *)0x192d9d;
    iVar5 = uv_fs_link(loop,puVar16,"test_file","test_file_link2",link_cb);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if (puStack_1318 != (uv_loop_t *)0x0) goto LAB_0019309e;
    puStack_1338 = (uv_loop_t *)0x192dcb;
    uv_run(loop,0);
    puStack_1318 = (uv_loop_t *)0x1;
    puStack_1320 = (uv_loop_t *)(long)link_cb_count;
    if (puStack_1320 != (uv_loop_t *)0x1) goto LAB_001930ad;
    puStack_1338 = (uv_loop_t *)0x192e0e;
    iVar5 = uv_fs_open(0,auStack_1310,"test_file_link2",2,0,0);
    puVar9 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if (puStack_1318 != (uv_loop_t *)0x0) goto LAB_001930bc;
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_001930cb;
    puVar22 = (uv__queue *)auStack_1310;
    puStack_1338 = (uv_loop_t *)0x192e5e;
    uv_fs_req_cleanup(puVar22);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_1338 = (uv_loop_t *)0x192e80;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_1330 = 0;
    puStack_1338 = (uv_loop_t *)0x192eb1;
    iov = uVar24;
    iVar5 = uv_fs_read(0,puVar22,(ulong)puVar9 & 0xffffffff,&iov,1,0);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((long)puStack_1318 < 0) goto LAB_001930da;
    puStack_1318 = (uv_loop_t *)auStack_1310._88_8_;
    puStack_1320 = (uv_loop_t *)0x0;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_001930e9;
    puStack_1338 = (uv_loop_t *)0x192f03;
    iVar5 = strcmp(buf,test_buf);
    puStack_1318 = (uv_loop_t *)(long)iVar5;
    puStack_1320 = (uv_loop_t *)0x0;
    if (puStack_1318 != (uv_loop_t *)0x0) goto LAB_001930f8;
    puStack_1338 = (uv_loop_t *)0x192f33;
    iVar5 = uv_fs_close(0,auStack_1310,(ulong)puVar9 & 0xffffffff,0);
    if (iVar5 != 0) goto LAB_00193107;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_0019310c;
    puStack_1338 = (uv_loop_t *)0x192f51;
    uv_fs_req_cleanup(auStack_1310);
    puStack_1338 = (uv_loop_t *)0x192f5f;
    uv_run(loop,0);
    puStack_1338 = (uv_loop_t *)0x192f6b;
    unlink("test_file");
    puStack_1338 = (uv_loop_t *)0x192f77;
    unlink("test_file_link");
    puStack_1338 = (uv_loop_t *)0x192f83;
    unlink("test_file_link2");
    puVar9 = loop;
    puStack_1338 = (uv_loop_t *)0x192f9b;
    uv_walk(loop,close_walk_cb,0);
    puStack_1338 = (uv_loop_t *)0x192fa5;
    uv_run(puVar9,0);
    puStack_1318 = (uv_loop_t *)0x0;
    puStack_1338 = (uv_loop_t *)0x192fba;
    iVar5 = uv_loop_close(loop);
    puStack_1320 = (uv_loop_t *)(long)iVar5;
    if (puStack_1318 == puStack_1320) {
      puStack_1338 = (uv_loop_t *)0x192fd6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_1338 = (uv_loop_t *)0x192ff4;
    run_test_fs_link_cold_1();
LAB_00192ff4:
    puStack_1338 = (uv_loop_t *)0x193003;
    run_test_fs_link_cold_25();
LAB_00193003:
    puStack_1338 = (uv_loop_t *)0x193012;
    run_test_fs_link_cold_2();
LAB_00193012:
    puStack_1338 = (uv_loop_t *)0x193021;
    run_test_fs_link_cold_3();
LAB_00193021:
    puStack_1338 = (uv_loop_t *)0x193026;
    run_test_fs_link_cold_4();
LAB_00193026:
    puStack_1338 = (uv_loop_t *)0x19302b;
    run_test_fs_link_cold_5();
LAB_0019302b:
    puStack_1338 = (uv_loop_t *)0x19303a;
    run_test_fs_link_cold_6();
LAB_0019303a:
    puStack_1338 = (uv_loop_t *)0x193049;
    run_test_fs_link_cold_7();
LAB_00193049:
    puVar16 = puVar9;
    puStack_1338 = (uv_loop_t *)0x193058;
    run_test_fs_link_cold_8();
LAB_00193058:
    puStack_1338 = (uv_loop_t *)0x193067;
    run_test_fs_link_cold_24();
LAB_00193067:
    puStack_1338 = (uv_loop_t *)0x193076;
    run_test_fs_link_cold_23();
LAB_00193076:
    puStack_1338 = (uv_loop_t *)0x193085;
    run_test_fs_link_cold_22();
LAB_00193085:
    puStack_1338 = (uv_loop_t *)0x193094;
    run_test_fs_link_cold_9();
LAB_00193094:
    puStack_1338 = (uv_loop_t *)0x193099;
    run_test_fs_link_cold_10();
LAB_00193099:
    puStack_1338 = (uv_loop_t *)0x19309e;
    run_test_fs_link_cold_11();
LAB_0019309e:
    puStack_1338 = (uv_loop_t *)0x1930ad;
    run_test_fs_link_cold_12();
LAB_001930ad:
    puStack_1338 = (uv_loop_t *)0x1930bc;
    run_test_fs_link_cold_13();
LAB_001930bc:
    puVar9 = puVar16;
    puStack_1338 = (uv_loop_t *)0x1930cb;
    run_test_fs_link_cold_14();
LAB_001930cb:
    puStack_1338 = (uv_loop_t *)0x1930da;
    run_test_fs_link_cold_21();
LAB_001930da:
    puStack_1338 = (uv_loop_t *)0x1930e9;
    run_test_fs_link_cold_20();
LAB_001930e9:
    puStack_1338 = (uv_loop_t *)0x1930f8;
    run_test_fs_link_cold_19();
LAB_001930f8:
    puStack_1338 = (uv_loop_t *)0x193107;
    run_test_fs_link_cold_15();
LAB_00193107:
    puStack_1338 = (uv_loop_t *)0x19310c;
    run_test_fs_link_cold_16();
LAB_0019310c:
    puStack_1338 = (uv_loop_t *)0x193111;
    run_test_fs_link_cold_17();
  }
  ppuVar18 = &puStack_1318;
  puStack_1338 = (uv_loop_t *)link_cb;
  run_test_fs_link_cold_18();
  puStack_1338 = (uv_loop_t *)(long)*(int *)(ppuVar18 + 9);
  uStack_1340 = 0x17;
  if (puStack_1338 == (uv_loop_t *)0x17) {
    puStack_1338 = ppuVar18[0xb];
    uStack_1340 = 0;
    if (puStack_1338 == (uv_loop_t *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar5 = uv_fs_req_cleanup();
      return iVar5;
    }
  }
  else {
    puStack_1350 = (uv__queue *)0x19317e;
    link_cb_cold_1();
  }
  puStack_1350 = (uv__queue *)run_test_fs_readlink;
  link_cb_cold_2();
  puStack_1358 = puVar9;
  puStack_1350 = puVar22;
  loop = (uv_loop_t *)uv_default_loop();
  iVar5 = uv_fs_readlink(loop,alStack_1518,"no_such_file",dummy_cb);
  if (iVar5 == 0) {
    iVar5 = uv_run(loop,0);
    if (iVar5 != 0) goto LAB_00193463;
    if (dummy_cb_count != 1) goto LAB_00193472;
    if (lStack_14b8 != 0) goto LAB_00193481;
    if (uStack_14c0 != 0xfffffffffffffffe) goto LAB_00193486;
    uv_fs_req_cleanup(alStack_1518);
    iVar5 = uv_fs_readlink(0,alStack_1518,"no_such_file",0);
    if (iVar5 != -2) goto LAB_00193495;
    if (lStack_14b8 != 0) goto LAB_001934a4;
    if (uStack_14c0 != 0xfffffffffffffffe) goto LAB_001934a9;
    uv_fs_req_cleanup(alStack_1518);
    iVar5 = uv_fs_open(0,alStack_1518,"test_file",0x42,0x180,0);
    uVar15 = uStack_14c0;
    if (iVar5 != 0) goto LAB_001934b8;
    if ((long)uStack_14c0 < 0) goto LAB_001934c7;
    uv_fs_req_cleanup(alStack_1518);
    iVar5 = uv_fs_close(0,alStack_1518,uVar15 & 0xffffffff,0);
    if (iVar5 != 0) goto LAB_001934d6;
    if (uStack_14c0 != 0) goto LAB_001934e5;
    uv_fs_req_cleanup(alStack_1518);
    iVar5 = uv_fs_readlink(0,alStack_1518,"test_file",0);
    if (iVar5 == -0x16) {
      uv_fs_req_cleanup(alStack_1518);
      unlink("test_file");
      puVar9 = loop;
      uv_walk(loop,close_walk_cb,0);
      uv_run(puVar9,0);
      alStack_1518[0] = 0;
      iVar5 = uv_loop_close(loop);
      if (alStack_1518[0] == iVar5) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00193503;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00193463:
    run_test_fs_readlink_cold_2();
LAB_00193472:
    run_test_fs_readlink_cold_3();
LAB_00193481:
    run_test_fs_readlink_cold_4();
LAB_00193486:
    run_test_fs_readlink_cold_5();
LAB_00193495:
    run_test_fs_readlink_cold_6();
LAB_001934a4:
    run_test_fs_readlink_cold_7();
LAB_001934a9:
    run_test_fs_readlink_cold_8();
LAB_001934b8:
    run_test_fs_readlink_cold_9();
LAB_001934c7:
    run_test_fs_readlink_cold_14();
LAB_001934d6:
    run_test_fs_readlink_cold_10();
LAB_001934e5:
    run_test_fs_readlink_cold_11();
  }
  run_test_fs_readlink_cold_12();
LAB_00193503:
  run_test_fs_readlink_cold_13();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, mkdtemp_cb_count);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT_OK(r);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT_NE(0, strcmp(mkdtemp_req1.path, mkdtemp_req2.path));

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}